

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O3

void CATCH2_INTERNAL_TEST_16(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StringRef message;
  StringRef message_00;
  StringRef message_01;
  StringRef message_02;
  StringRef message_03;
  StringRef message_04;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_88;
  string local_78;
  AssertionHandler local_58;
  
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/TypeTraits.cpp"
  ;
  local_78._M_string_length = 0xbd;
  macroName.m_size = 7;
  macroName.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"std::same_as<int&, std::add_volatile_t<int&>>",0x2d);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message.m_size = local_78._M_string_length;
  message.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message);
  paVar1 = &local_78.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/TypeTraits.cpp"
  ;
  local_78._M_string_length = 0xbe;
  macroName_00.m_size = 7;
  macroName_00.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_00,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"std::same_as<volatile int&, sl::add_type_volatile_t<int&>>",0x3a);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_00.m_size = local_78._M_string_length;
  message_00.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/TypeTraits.cpp"
  ;
  local_78._M_string_length = 0xc0;
  macroName_01.m_size = 7;
  macroName_01.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_01,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"std::same_as<int* volatile, std::add_volatile_t<int*>>",0x36);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_01.m_size = local_78._M_string_length;
  message_01.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/TypeTraits.cpp"
  ;
  local_78._M_string_length = 0xc1;
  macroName_02.m_size = 7;
  macroName_02.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_02,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,"std::same_as<volatile int*, sl::add_type_volatile_t<int*>>",0x3a);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_02.m_size = local_78._M_string_length;
  message_02.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/TypeTraits.cpp"
  ;
  local_78._M_string_length = 0xc3;
  macroName_03.m_size = 7;
  macroName_03.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_03,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,
             "std::same_as<volatile int* volatile, std::add_volatile_t<volatile int*>>",0x48);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_03.m_size = local_78._M_string_length;
  message_03.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_78._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/TypeTraits.cpp"
  ;
  local_78._M_string_length = 0xc4;
  macroName_04.m_size = 7;
  macroName_04.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_58,macroName_04,(SourceLineInfo *)&local_78,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_88.m_oss,
             "std::same_as<volatile int* volatile, sl::add_type_volatile_t<int* volatile>>",0x4c);
  Catch::ReusableStringStream::str_abi_cxx11_(&local_78,&local_88);
  message_04.m_size = local_78._M_string_length;
  message_04.m_start = local_78._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_58,Ok,message_04);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_58);
  if (local_58.m_completed == false) {
    (*(local_58.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }